

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.h
# Opt level: O0

void __thiscall
Fixpp::Field<Fixpp::TagT<349U,_Fixpp::Type::Data>_>::Field
          (Field<Fixpp::TagT<349U,_Fixpp::Type::Data>_> *this,
          Field<Fixpp::TagT<349U,_Fixpp::Type::Data>_> *other)

{
  Field<Fixpp::TagT<349U,_Fixpp::Type::Data>_> *other_local;
  Field<Fixpp::TagT<349U,_Fixpp::Type::Data>_> *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->empty_ = false;
  operator=(this,other);
  return;
}

Assistant:

Field(const Field& other)
        {
            operator=(other);
        }